

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void print_stack_union(FILE *out,lemon *lemp,int *plineno,int mhflag)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  byte *__s;
  symbol **ppsVar4;
  symbol *psVar5;
  symbol *psVar6;
  ushort *puVar7;
  void *__ptr;
  size_t __nmemb;
  int iVar8;
  uint uVar9;
  void *__ptr_00;
  size_t sVar10;
  size_t sVar11;
  char *pcVar12;
  ushort **ppuVar13;
  char *__dest;
  char cVar14;
  byte *pbVar15;
  int iVar16;
  ulong uVar17;
  char *pcVar18;
  char *pcVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  byte *pbVar23;
  uint local_60;
  
  iVar3 = lemp->nsymbol;
  lVar21 = (long)iVar3;
  __nmemb = lVar21 * 2;
  pcVar18 = (char *)0x8;
  __ptr_00 = calloc(__nmemb,8);
  __s = (byte *)lemp->vartype;
  if (__s == (byte *)0x0) {
    sVar10 = 0;
  }
  else {
    sVar10 = strlen((char *)__s);
  }
  iVar8 = (int)sVar10;
  if (0 < iVar3) {
    ppsVar4 = lemp->symbols;
    lVar22 = 0;
    do {
      pcVar12 = ppsVar4[lVar22]->datatype;
      if (pcVar12 != (char *)0x0) {
        sVar11 = strlen(pcVar12);
        uVar9 = (uint)sVar11;
        if ((int)(uint)sVar11 < (int)(uint)sVar10) {
          uVar9 = (uint)sVar10;
        }
        sVar10 = (size_t)uVar9;
      }
      iVar8 = (int)sVar10;
      lVar22 = lVar22 + 1;
    } while (lVar21 != lVar22);
  }
  pcVar19 = (char *)(long)(iVar8 * 2 + 1);
  pcVar12 = (char *)malloc((size_t)pcVar19);
  if ((__ptr_00 == (void *)0x0) || (pcVar12 == (char *)0x0)) {
LAB_0010b0f7:
    print_stack_union_cold_2();
    if ((*(int *)(pcVar18 + 0xc) == *(int *)(pcVar19 + 0xc)) &&
       (pcVar19 != pcVar18 && *(int *)(pcVar18 + 0x10) == *(int *)(pcVar19 + 0x10))) {
      __assert_fail("c!=0 || p1==p2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/misc/lemon.c"
                    ,0xe1f,"int axset_compare(const void *, const void *)");
    }
    return;
  }
  local_60 = (uint)__nmemb;
  if (0 < iVar3) {
    ppsVar4 = lemp->symbols;
    psVar5 = lemp->errsym;
    lVar22 = 0;
    do {
      psVar6 = ppsVar4[lVar22];
      if (psVar6 == psVar5) {
        psVar6->dtnum = local_60 | 1;
      }
      else if ((psVar6->type == NONTERMINAL) &&
              (pbVar23 = (byte *)psVar6->datatype, __s != (byte *)0x0 || pbVar23 != (byte *)0x0)) {
        if (pbVar23 == (byte *)0x0) {
          pbVar23 = __s;
        }
        ppuVar13 = __ctype_b_loc();
        puVar7 = *ppuVar13;
        pbVar15 = pbVar23 + -1;
        do {
          pbVar23 = pbVar23 + 1;
          pbVar1 = pbVar15 + 1;
          uVar20 = (ulong)(char)*pbVar1;
          pbVar15 = pbVar15 + 1;
        } while ((*(byte *)((long)puVar7 + uVar20 * 2 + 1) & 0x20) != 0);
        iVar8 = 0;
        if (*pbVar1 != 0) {
          uVar17 = 0;
          do {
            pcVar12[uVar17] = (char)uVar20;
            uVar17 = uVar17 + 1;
            bVar2 = *pbVar23;
            uVar20 = (ulong)bVar2;
            pbVar23 = pbVar23 + 1;
          } while (bVar2 != 0);
          if ((int)uVar17 < 1) {
LAB_0010ae5b:
            iVar8 = (int)uVar17;
          }
          else {
            do {
              iVar16 = (int)uVar17;
              if ((*(byte *)((long)puVar7 + (long)pcVar12[(uVar17 & 0xffffffff) - 1] * 2 + 1) & 0x20
                  ) == 0) goto LAB_0010ae5b;
              uVar17 = (ulong)(iVar16 - 1);
            } while (1 < iVar16);
          }
        }
        pcVar12[iVar8] = '\0';
        pcVar18 = lemp->tokentype;
        if ((pcVar18 == (char *)0x0) || (iVar8 = strcmp(pcVar12,pcVar18), iVar8 != 0)) {
          cVar14 = *pcVar12;
          uVar9 = 0;
          pcVar19 = pcVar12;
          if (cVar14 != '\0') {
            do {
              pcVar18 = (char *)(ulong)(uVar9 * 0x35);
              uVar9 = (int)cVar14 + uVar9 * 0x35;
              cVar14 = pcVar19[1];
              pcVar19 = pcVar19 + 1;
            } while (cVar14 != '\0');
            uVar9 = uVar9 & 0x7fffffff;
          }
          uVar20 = (ulong)uVar9 % (__nmemb & 0xffffffff);
          while( true ) {
            pcVar19 = *(char **)((long)__ptr_00 + uVar20 * 8);
            if (pcVar19 == (char *)0x0) break;
            pcVar18 = pcVar12;
            iVar8 = strcmp(pcVar19,pcVar12);
            uVar9 = (int)uVar20 + 1;
            if (iVar8 == 0) {
              psVar6->dtnum = uVar9;
              goto LAB_0010af38;
            }
            if ((int)local_60 <= (int)uVar9) {
              uVar9 = 0;
            }
            uVar20 = (ulong)uVar9;
          }
          psVar6->dtnum = (int)uVar20 + 1;
          sVar10 = strlen(pcVar12);
          pcVar19 = (char *)(long)((int)sVar10 + 1);
          __dest = (char *)malloc((size_t)pcVar19);
          *(char **)((long)__ptr_00 + uVar20 * 8) = __dest;
          if (__dest == (char *)0x0) {
            print_stack_union_cold_1();
            goto LAB_0010b0f7;
          }
          strcpy(__dest,pcVar12);
        }
        else {
          psVar6->dtnum = 0;
        }
      }
      else {
        psVar6->dtnum = 0;
      }
LAB_0010af38:
      lVar22 = lVar22 + 1;
    } while (lVar22 != lVar21);
  }
  pcVar18 = "Parse";
  if (lemp->name != (char *)0x0) {
    pcVar18 = lemp->name;
  }
  iVar8 = *plineno;
  if (mhflag != 0) {
    fwrite("#if INTERFACE\n",0xe,1,(FILE *)out);
    iVar8 = iVar8 + 1;
  }
  pcVar19 = "void*";
  if (lemp->tokentype != (char *)0x0) {
    pcVar19 = lemp->tokentype;
  }
  fprintf((FILE *)out,"#define %sTOKENTYPE %s\n",pcVar18,pcVar19);
  if (mhflag == 0) {
    iVar8 = iVar8 + 1;
  }
  else {
    fwrite("#endif\n",7,1,(FILE *)out);
    iVar8 = iVar8 + 2;
  }
  fwrite("typedef union {\n",0x10,1,(FILE *)out);
  fwrite("  int yyinit;\n",0xe,1,(FILE *)out);
  fprintf((FILE *)out,"  %sTOKENTYPE yy0;\n",pcVar18);
  iVar8 = iVar8 + 3;
  if (0 < iVar3) {
    uVar20 = 0;
    do {
      __ptr = *(void **)((long)__ptr_00 + uVar20 * 8);
      if (__ptr != (void *)0x0) {
        fprintf((FILE *)out,"  %s yy%d;\n",__ptr,(ulong)((int)uVar20 + 1));
        iVar8 = iVar8 + 1;
        free(__ptr);
      }
      uVar20 = uVar20 + 1;
    } while ((__nmemb & 0xffffffff) != uVar20);
  }
  if (lemp->errsym->useCnt != 0) {
    fprintf((FILE *)out,"  int yy%d;\n",(ulong)(uint)lemp->errsym->dtnum);
    iVar8 = iVar8 + 1;
  }
  free(pcVar12);
  free(__ptr_00);
  fwrite("} YYMINORTYPE;\n",0xf,1,(FILE *)out);
  *plineno = iVar8 + 1;
  return;
}

Assistant:

void print_stack_union(
  FILE *out,                  /* The output stream */
  struct lemon *lemp,         /* The main info structure for this parser */
  int *plineno,               /* Pointer to the line number */
  int mhflag                  /* True if generating makeheaders output */
){
  int lineno = 0;           /* The line number of the output */
  char **types;             /* A hash table of datatypes */
  int arraysize;            /* Size of the "types" array */
  int maxdtlength;          /* Maximum length of any ".datatype" field. */
  char *stddt;              /* Standardized name for a datatype */
  int i,j;                  /* Loop counters */
  int hash;                 /* For hashing the name of a type */
  const char *name;         /* Name of the parser */

  /* Allocate and initialize types[] and allocate stddt[] */
  arraysize = lemp->nsymbol * 2;
  types = (char**)calloc( arraysize, sizeof(char*) );
  for(i=0; i<arraysize; i++) types[i] = 0;
  maxdtlength = 0;
  if( lemp->vartype ){
    maxdtlength = lemonStrlen(lemp->vartype);
  }
  for(i=0; i<lemp->nsymbol; i++){
    int len;
    struct symbol *sp = lemp->symbols[i];
    if( sp->datatype==0 ) continue;
    len = lemonStrlen(sp->datatype);
    if( len>maxdtlength ) maxdtlength = len;
  }
  stddt = (char*)malloc( maxdtlength*2 + 1 );
  if( types==0 || stddt==0 ){
    fprintf(stderr,"Out of memory.\n");
    exit(1);
  }

  /* Build a hash table of datatypes. The ".dtnum" field of each symbol
  ** is filled in with the hash index plus 1.  A ".dtnum" value of 0 is
  ** used for terminal symbols.  If there is no %default_type defined then
  ** 0 is also used as the .dtnum value for nonterminals which do not specify
  ** a datatype using the %type directive.
  */
  for(i=0; i<lemp->nsymbol; i++){
    struct symbol *sp = lemp->symbols[i];
    char *cp;
    if( sp==lemp->errsym ){
      sp->dtnum = arraysize+1;
      continue;
    }
    if( sp->type!=NONTERMINAL || (sp->datatype==0 && lemp->vartype==0) ){
      sp->dtnum = 0;
      continue;
    }
    cp = sp->datatype;
    if( cp==0 ) cp = lemp->vartype;
    j = 0;
    while( isspace(*cp) ) cp++;
    while( *cp ) stddt[j++] = *cp++;
    while( j>0 && isspace(stddt[j-1]) ) j--;
    stddt[j] = 0;
    if( lemp->tokentype && strcmp(stddt, lemp->tokentype)==0 ){
      sp->dtnum = 0;
      continue;
    }
    hash = 0;
    for(j=0; stddt[j]; j++){
      hash = hash*53 + stddt[j];
    }
    hash = (hash & 0x7fffffff)%arraysize;
    while( types[hash] ){
      if( strcmp(types[hash],stddt)==0 ){
        sp->dtnum = hash + 1;
        break;
      }
      hash++;
      if( hash>=arraysize ) hash = 0;
    }
    if( types[hash]==0 ){
      sp->dtnum = hash + 1;
      types[hash] = (char*)malloc( lemonStrlen(stddt)+1 );
      if( types[hash]==0 ){
        fprintf(stderr,"Out of memory.\n");
        exit(1);
      }
      strcpy(types[hash],stddt);
    }
  }

  /* Print out the definition of YYTOKENTYPE and YYMINORTYPE */
  name = lemp->name ? lemp->name : "Parse";
  lineno = *plineno;
  if( mhflag ){ fprintf(out,"#if INTERFACE\n"); lineno++; }
  fprintf(out,"#define %sTOKENTYPE %s\n",name,
    lemp->tokentype?lemp->tokentype:"void*");  lineno++;
  if( mhflag ){ fprintf(out,"#endif\n"); lineno++; }
  fprintf(out,"typedef union {\n"); lineno++;
  fprintf(out,"  int yyinit;\n"); lineno++;
  fprintf(out,"  %sTOKENTYPE yy0;\n",name); lineno++;
  for(i=0; i<arraysize; i++){
    if( types[i]==0 ) continue;
    fprintf(out,"  %s yy%d;\n",types[i],i+1); lineno++;
    free(types[i]);
  }
  if( lemp->errsym->useCnt ){
    fprintf(out,"  int yy%d;\n",lemp->errsym->dtnum); lineno++;
  }
  free(stddt);
  free(types);
  fprintf(out,"} YYMINORTYPE;\n"); lineno++;
  *plineno = lineno;
}